

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Skeleton_blockers_simplices_iterators.h
# Opt level: O1

bool __thiscall
Gudhi::skeleton_blocker::
Simplex_around_vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>,_Gudhi::skeleton_blocker::Skeleton_blocker_link_superior<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>_>
::equal(Simplex_around_vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>,_Gudhi::skeleton_blocker::Skeleton_blocker_link_superior<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>_>
        *this,Simplex_around_vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>,_Gudhi::skeleton_blocker::Skeleton_blocker_link_superior<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>_>
              *other)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  
  if ((this->complex == other->complex) && ((this->v).vertex == (other->v).vertex)) {
    p_Var1 = (this->nodes_to_be_seen).
             super__List_base<Gudhi::skeleton_blocker::Trie<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>_*,_std::allocator<Gudhi::skeleton_blocker::Trie<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>_*>_>
             ._M_impl._M_node.super__List_node_base._M_next;
    if (p_Var1 == (_List_node_base *)&this->nodes_to_be_seen) {
      return p_Var1 == (_List_node_base *)&this->nodes_to_be_seen &&
             (other->nodes_to_be_seen).
             super__List_base<Gudhi::skeleton_blocker::Trie<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>_*,_std::allocator<Gudhi::skeleton_blocker::Trie<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>_*>_>
             ._M_impl._M_node.super__List_node_base._M_next ==
             (_List_node_base *)&other->nodes_to_be_seen;
    }
    p_Var2 = (other->nodes_to_be_seen).
             super__List_base<Gudhi::skeleton_blocker::Trie<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>_*,_std::allocator<Gudhi::skeleton_blocker::Trie<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>_*>_>
             ._M_impl._M_node.super__List_node_base._M_next;
    if (p_Var2 != (_List_node_base *)&other->nodes_to_be_seen) {
      return *(int *)&(p_Var1[1]._M_next)->_M_next == *(int *)&(p_Var2[1]._M_next)->_M_next;
    }
  }
  return false;
}

Assistant:

bool equal(const Simplex_around_vertex_iterator& other) const {
    bool same_complex = (complex == other.complex);
    if (!same_complex)
      return false;

    if (!(v == other.v))
      return false;

    bool both_empty = nodes_to_be_seen.empty() && other.nodes_to_be_seen.empty();
    if (both_empty)
      return true;

    bool both_non_empty = !nodes_to_be_seen.empty() && !other.nodes_to_be_seen.empty();

    // one is empty the other is not
    if (!both_non_empty) return false;

    bool same_node = (**(nodes_to_be_seen.begin()) == **(other.nodes_to_be_seen.begin()));
    return same_node;
  }